

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<ProjectBuilderSubDirs*>::emplace<ProjectBuilderSubDirs*&>
          (QPodArrayOps<ProjectBuilderSubDirs_*> *this,qsizetype i,ProjectBuilderSubDirs **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  ProjectBuilderSubDirs **ppPVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<ProjectBuilderSubDirs_*> *in_RDI;
  ProjectBuilderSubDirs **where;
  GrowthPosition pos;
  ProjectBuilderSubDirs *tmp;
  bool detach;
  QArrayDataPointer<ProjectBuilderSubDirs_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  ProjectBuilderSubDirs *pPVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<ProjectBuilderSubDirs_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<ProjectBuilderSubDirs_*>::freeSpaceAtEnd
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppPVar3 = QArrayDataPointer<ProjectBuilderSubDirs_*>::end(in_RDI);
      *ppPVar3 = (ProjectBuilderSubDirs *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<ProjectBuilderSubDirs_*>::freeSpaceAtBegin
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppPVar3 = QArrayDataPointer<ProjectBuilderSubDirs_*>::begin
                          ((QArrayDataPointer<ProjectBuilderSubDirs_*> *)0x1550f7);
      ppPVar3[-1] = (ProjectBuilderSubDirs *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pPVar5 = (ProjectBuilderSubDirs *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<ProjectBuilderSubDirs_*>::detachAndGrow
            ((QArrayDataPointer<ProjectBuilderSubDirs_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0)
             ,(GrowthPosition)((ulong)pPVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (ProjectBuilderSubDirs ***)in_stack_ffffffffffffffc8,in_RDI);
  ppPVar3 = QPodArrayOps<ProjectBuilderSubDirs_*>::createHole
                      ((QPodArrayOps<ProjectBuilderSubDirs_*> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pPVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppPVar3 = pPVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }